

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::IGXMLScanner::endElementPSVI
          (IGXMLScanner *this,SchemaElementDecl *elemDecl,DatatypeValidator *memberDV)

{
  DatatypeValidator *pDVar1;
  PSVIElement *this_00;
  XSModel *schemaInfo;
  PSVIHandler *pPVar2;
  XMLStringPool *pXVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *defaultValue;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  XSSimpleTypeDefinition *local_a8;
  XSElementDeclaration *local_90;
  bool local_69;
  XMLCh *local_60;
  XMLCh *canonicalValue;
  ModelTypes modelType;
  bool isMixed;
  XSTypeDefinition *typeDef;
  VALIDITY_STATE validity;
  ASSESSMENT_TYPE validationAttempted;
  DatatypeValidator *memberDV_local;
  SchemaElementDecl *elemDecl_local;
  IGXMLScanner *this_local;
  
  typeDef._0_4_ = VALIDITY_NOTKNOWN;
  if ((this->fPSVIElemContext).fFullValidationDepth < (this->fPSVIElemContext).fElemDepth) {
    typeDef._4_4_ = VALIDATION_FULL;
  }
  else {
    bVar4 = (this->fPSVIElemContext).fElemDepth <= (this->fPSVIElemContext).fNoneValidationDepth;
    if (bVar4) {
      iVar6 = (this->fPSVIElemContext).fElemDepth + -1;
      (this->fPSVIElemContext).fNoneValidationDepth = iVar6;
      (this->fPSVIElemContext).fFullValidationDepth = iVar6;
    }
    typeDef._4_4_ = (ASSESSMENT_TYPE)bVar4;
  }
  if (((((this->super_XMLScanner).fValidate & 1U) != 0) &&
      (bVar4 = XMLElementDecl::isDeclared(&elemDecl->super_XMLElementDecl), bVar4)) &&
     (typeDef._0_4_ = VALIDITY_VALID, ((this->fPSVIElemContext).fErrorOccurred & 1U) != 0)) {
    typeDef._0_4_ = VALIDITY_INVALID;
  }
  _modelType = (XSTypeDefinition *)0x0;
  local_69 = false;
  if ((this->fPSVIElemContext).fCurrentTypeInfo == (ComplexTypeInfo *)0x0) {
    if ((this->fPSVIElemContext).fCurrentDV != (DatatypeValidator *)0x0) {
      _modelType = (XSTypeDefinition *)
                   XSModel::getXSObject(this->fModel,(this->fPSVIElemContext).fCurrentDV);
    }
  }
  else {
    _modelType = (XSTypeDefinition *)
                 XSModel::getXSObject(this->fModel,(this->fPSVIElemContext).fCurrentTypeInfo);
    iVar6 = ComplexTypeInfo::getContentType((this->fPSVIElemContext).fCurrentTypeInfo);
    local_69 = iVar6 == 2 || iVar6 == 3;
  }
  local_60 = (XMLCh *)0x0;
  if ((((this->fPSVIElemContext).fNormalizedValue != (XMLCh *)0x0) && (!local_69)) &&
     ((VALIDITY_STATE)typeDef == VALIDITY_VALID)) {
    if (memberDV == (DatatypeValidator *)0x0) {
      if ((this->fPSVIElemContext).fCurrentDV != (DatatypeValidator *)0x0) {
        pDVar1 = (this->fPSVIElemContext).fCurrentDV;
        iVar6 = (*(pDVar1->super_XSerializable)._vptr_XSerializable[7])
                          (pDVar1,(this->fPSVIElemContext).fNormalizedValue,
                           (this->super_XMLScanner).fMemoryManager,0);
        local_60 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      }
    }
    else {
      iVar6 = (*(memberDV->super_XSerializable)._vptr_XSerializable[7])
                        (memberDV,(this->fPSVIElemContext).fNormalizedValue,
                         (this->super_XMLScanner).fMemoryManager,0);
      local_60 = (XMLCh *)CONCAT44(extraout_var,iVar6);
    }
  }
  this_00 = this->fPSVIElement;
  pXVar8 = (this->super_XMLScanner).fRootElemName;
  bVar4 = (this->fPSVIElemContext).fIsSpecified;
  bVar5 = XMLElementDecl::isDeclared(&elemDecl->super_XMLElementDecl);
  if (bVar5) {
    local_90 = (XSElementDeclaration *)XSModel::getXSObject(this->fModel,elemDecl);
  }
  else {
    local_90 = (XSElementDeclaration *)0x0;
  }
  if (memberDV == (DatatypeValidator *)0x0) {
    local_a8 = (XSSimpleTypeDefinition *)0x0;
  }
  else {
    local_a8 = (XSSimpleTypeDefinition *)XSModel::getXSObject(this->fModel,memberDV);
  }
  schemaInfo = this->fModel;
  defaultValue = SchemaElementDecl::getDefaultValue(elemDecl);
  PSVIElement::reset(this_00,(VALIDITY_STATE)typeDef,typeDef._4_4_,pXVar8,(bool)(bVar4 & 1),local_90
                     ,_modelType,local_a8,schemaInfo,defaultValue,
                     (this->fPSVIElemContext).fNormalizedValue,local_60,(XSNotationDeclaration *)0x0
                    );
  pPVar2 = (this->super_XMLScanner).fPSVIHandler;
  pXVar8 = XMLElementDecl::getBaseName(&elemDecl->super_XMLElementDecl);
  pXVar3 = (this->super_XMLScanner).fURIStringPool;
  uVar7 = XMLElementDecl::getURI(&elemDecl->super_XMLElementDecl);
  iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar7);
  (*pPVar2->_vptr_PSVIHandler[2])(pPVar2,pXVar8,CONCAT44(extraout_var_01,iVar6),this->fPSVIElement);
  (this->fPSVIElemContext).fElemDepth = (this->fPSVIElemContext).fElemDepth + -1;
  return;
}

Assistant:

void IGXMLScanner::endElementPSVI(SchemaElementDecl* const elemDecl,
                                  DatatypeValidator* const memberDV)
{
    PSVIElement::ASSESSMENT_TYPE validationAttempted;
    PSVIElement::VALIDITY_STATE validity = PSVIElement::VALIDITY_NOTKNOWN;

    if (fPSVIElemContext.fElemDepth > fPSVIElemContext.fFullValidationDepth)
        validationAttempted = PSVIElement::VALIDATION_FULL;
    else if (fPSVIElemContext.fElemDepth > fPSVIElemContext.fNoneValidationDepth)
        validationAttempted = PSVIElement::VALIDATION_NONE;
    else
    {
        validationAttempted  = PSVIElement::VALIDATION_PARTIAL;
		fPSVIElemContext.fFullValidationDepth =
            fPSVIElemContext.fNoneValidationDepth = fPSVIElemContext.fElemDepth - 1;
    }

    if (fValidate && elemDecl->isDeclared())
    {
        validity = (fPSVIElemContext.fErrorOccurred)
            ? PSVIElement::VALIDITY_INVALID : PSVIElement::VALIDITY_VALID;
    }

    XSTypeDefinition* typeDef = 0;
    bool isMixed = false;
    if (fPSVIElemContext.fCurrentTypeInfo)
    {
        typeDef = (XSTypeDefinition*) fModel->getXSObject(fPSVIElemContext.fCurrentTypeInfo);
        SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes)fPSVIElemContext.fCurrentTypeInfo->getContentType();
        isMixed = (modelType == SchemaElementDecl::Mixed_Simple
                || modelType == SchemaElementDecl::Mixed_Complex);
    }
    else if (fPSVIElemContext.fCurrentDV)
        typeDef = (XSTypeDefinition*) fModel->getXSObject(fPSVIElemContext.fCurrentDV);

    XMLCh* canonicalValue = 0;
    if (fPSVIElemContext.fNormalizedValue && !isMixed &&
            validity == PSVIElement::VALIDITY_VALID)
    {
        if (memberDV)
            canonicalValue = (XMLCh*) memberDV->getCanonicalRepresentation(fPSVIElemContext.fNormalizedValue, fMemoryManager);
        else if (fPSVIElemContext.fCurrentDV)
            canonicalValue = (XMLCh*) fPSVIElemContext.fCurrentDV->getCanonicalRepresentation(fPSVIElemContext.fNormalizedValue, fMemoryManager);
    }

    fPSVIElement->reset
    (
        validity
        , validationAttempted
        , fRootElemName
        , fPSVIElemContext.fIsSpecified
        , (elemDecl->isDeclared())
            ? (XSElementDeclaration*) fModel->getXSObject(elemDecl) : 0
        , typeDef
        , (memberDV) ? (XSSimpleTypeDefinition*) fModel->getXSObject(memberDV) : 0
        , fModel
        , elemDecl->getDefaultValue()
        , fPSVIElemContext.fNormalizedValue
        , canonicalValue
    );

    fPSVIHandler->handleElementPSVI
    (
        elemDecl->getBaseName()
        , fURIStringPool->getValueForId(elemDecl->getURI())
        , fPSVIElement
    );

    // decrease element depth
    fPSVIElemContext.fElemDepth--;

}